

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O0

void __thiscall glTF2::AssetMetadata::AssetMetadata(AssetMetadata *this)

{
  allocator local_11;
  AssetMetadata *local_10;
  AssetMetadata *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->generator);
  {unnamed_type#1}::AssetMetadata((_unnamed_type_1_ *)&this->profile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->version,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return;
}

Assistant:

AssetMetadata() : version("") {}